

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

void __thiscall NodeList::add_node(NodeList *this,GridNode *node)

{
  uint uVar1;
  GridNode **ppGVar2;
  ulong uVar3;
  int i;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  void *unaff_R15;
  
  uVar1 = this->count;
  lVar7 = (long)(int)uVar1;
  this->count = uVar1 + 1;
  if (this->capacity == uVar1) {
    iVar6 = (int)((float)(int)uVar1 * 1.5);
    if ((int)uVar1 < 4) {
      iVar6 = uVar1 + 1;
    }
    this->capacity = iVar6;
    if (0 < (int)uVar1) {
      unaff_R15 = operator_new__(lVar7 * 8);
      ppGVar2 = this->list;
      for (lVar4 = 0; lVar7 != lVar4; lVar4 = lVar4 + 1) {
        *(GridNode **)((long)unaff_R15 + lVar4 * 8) = ppGVar2[lVar4];
      }
    }
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar6) {
      uVar5 = (long)iVar6 << 3;
    }
    ppGVar2 = (GridNode **)operator_new__(uVar5);
    this->list = ppGVar2;
    uVar3 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar3;
    }
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      this->list[uVar3] = *(GridNode **)((long)unaff_R15 + uVar3 * 8);
    }
  }
  this->list[lVar7] = node;
  return;
}

Assistant:

void add_node(GridNode *node)
    {
        count++;
        if (capacity == count - 1)
        {
            capacity = (capacity <= 3) ? (capacity + 1) : ((int)(capacity * 1.5f));
            GridNode **tempList;
            if (count > 1)
            {
                tempList = new GridNode *[count - 1];
                for (int i = 0; i < count - 1; i++)
                {
                    tempList[i] = list[i];
                }
            }
            list = new GridNode *[capacity];
            for (int i = 0; i < count - 1; i++)
            {
                list[i] = tempList[i];
            }
        }
        list[count - 1] = node;
    }